

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O1

void positionDequeFindAdjacentTS
               (double ts,dequePositionTy *l,positionTy **pBefore,positionTy **pAfter)

{
  positionTy *ppVar1;
  bool bVar2;
  positionTy *p;
  positionTy *ppVar3;
  _Map_pointer pppVar4;
  positionTy *ppVar5;
  positionTy **pppVar6;
  
  *pAfter = (positionTy *)0x0;
  *pBefore = (positionTy *)0x0;
  ppVar3 = (l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppVar1 = (l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (ppVar3 != ppVar1) {
    ppVar5 = (l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
    pppVar4 = (l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    do {
      bVar2 = ts < ppVar3->_ts;
      pppVar6 = pAfter;
      if (!bVar2) {
        pppVar6 = pBefore;
      }
      *pppVar6 = ppVar3;
      if (bVar2) {
        return;
      }
      ppVar3 = ppVar3 + 1;
      if (ppVar3 == ppVar5) {
        ppVar3 = pppVar4[1];
        pppVar4 = pppVar4 + 1;
        ppVar5 = ppVar3 + 7;
      }
    } while (ppVar3 != ppVar1);
  }
  return;
}

Assistant:

void positionDequeFindAdjacentTS (double ts, dequePositionTy& l,
                                  positionTy*& pBefore, positionTy*& pAfter)
{
    // init
    pBefore = pAfter = nullptr;
    
    // loop
    for (positionTy& p: l) {
        if (p.ts() <= ts)
            pBefore = &p;           // while less than timestamp keep pBefore updated
        else {
            pAfter = &p;            // now found (first) position greater then ts
            return;                 // short-cut...ts in l would only further increase
        }
    }
}